

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_schemas.cpp
# Opt level: O3

bool duckdb::DefaultSchemaGenerator::IsDefaultSchema(string *input_schema)

{
  long lVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  string schema;
  string local_40;
  
  StringUtil::Lower(&local_40,input_schema);
  iVar2 = ::std::__cxx11::string::compare((char *)&local_40);
  if (iVar2 == 0) {
    bVar4 = true;
  }
  else {
    lVar3 = 0;
    do {
      lVar1 = *(long *)(internal_schemas + lVar3 * 8 + 8);
      if (lVar3 == 1) break;
      iVar2 = ::std::__cxx11::string::compare((char *)&local_40);
      lVar3 = lVar3 + 1;
    } while (iVar2 != 0);
    bVar4 = lVar1 != 0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return bVar4;
}

Assistant:

bool DefaultSchemaGenerator::IsDefaultSchema(const string &input_schema) {
	auto schema = StringUtil::Lower(input_schema);
	for (idx_t index = 0; internal_schemas[index].name != nullptr; index++) {
		if (internal_schemas[index].name == schema) {
			return true;
		}
	}
	return false;
}